

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_dc_predictor_64x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 in_XMM0_Qa;
  undefined8 uVar5;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i row;
  uint16_t sum;
  __m256i sum_left;
  __m256i sum_above;
  uint8_t *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  __m256i *in_stack_fffffffffffffe70;
  undefined1 local_182;
  uint8_t *in_stack_ffffffffffffff10;
  undefined8 uStack_68;
  
  dc_sum_64(in_stack_ffffffffffffff10);
  uVar5 = in_XMM0_Qa;
  dc_sum_64(in_stack_ffffffffffffff10);
  auVar4._8_8_ = uVar5;
  auVar4._0_8_ = uVar5;
  auVar4._16_8_ = uVar5;
  auVar4._24_8_ = uVar5;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar3 = vpaddw_avx2(auVar4,auVar3);
  local_182 = (byte)((ushort)(auVar3._0_2_ + 0x40U) >> 7);
  auVar1 = vpinsrb_avx(ZEXT116(local_182),(uint)local_182,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_182,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(local_182),(uint)local_182,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_182,0xe);
  vpinsrb_avx(auVar2,(uint)local_182,0xf);
  uStack_68 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,8);
  row_store_64xh(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                 uStack_68);
  return;
}

Assistant:

void aom_dc_predictor_64x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_64(above);
  __m256i sum_left = dc_sum_64(left);
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 64;
  sum /= 128;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_64xh(&row, 64, dst, stride);
}